

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_long>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,uint *params,
          unsigned_long *params_1)

{
  EVP_PKEY_CTX *ctx;
  undefined4 in_register_00000014;
  unsigned_long *params_00;
  String *local_d0;
  String local_68;
  String local_50;
  char *local_30;
  char *macroArgs_local;
  char *condition_local;
  Type code_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  this->exception = (Exception *)0x0;
  local_30 = macroArgs;
  macroArgs_local = condition;
  condition_local._0_4_ = code;
  condition_local._4_4_ = line;
  _code_local = (EVP_PKEY_CTX *)file;
  file_local = (char *)this;
  str<unsigned_int&>(&local_68,(kj *)params,(uint *)CONCAT44(in_register_00000014,line));
  str<unsigned_long&>(&local_50,(kj *)params_1,params_00);
  ctx = _code_local;
  arrayPtr<kj::String>(&local_68,2);
  init(this,ctx);
  local_d0 = (String *)&stack0xffffffffffffffc8;
  do {
    local_d0 = local_d0 + -1;
    String::~String(local_d0);
  } while (local_d0 != &local_68);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}